

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<Server_> * __thiscall
pybind11::class_<Server_>::def<Neyn::Error(Neyn::Server::*)()>
          (class_<Server_> *this,char *name_,offset_in_Server_to_subr *f)

{
  offset_in_Filer__to_subr f_00;
  name *extra;
  handle local_70;
  PyObject *local_68;
  handle local_60;
  handle local_58;
  sibling local_50;
  is_method local_48;
  is_method local_40;
  void *local_38;
  offset_in_Server_to_subr local_30;
  cpp_function local_28;
  cpp_function cf;
  offset_in_Server_to_subr *f_local;
  char *name__local;
  class_<Server_> *this_local;
  
  local_38 = (void *)*f;
  local_30 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  f_00 = _Server____pybind11__method_adaptor<Server_,Neyn::Error,Neyn::Server>_Neyn__Error_Neyn__Server________
                   (local_38,local_30);
  pybind11::name::name((name *)&local_40,name_);
  is_method::is_method(&local_48,(handle *)this);
  local_60.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  none::none((none *)&local_70);
  local_68 = local_70.m_ptr;
  getattr((pybind11 *)&local_58,local_60,name_,local_70);
  sibling::sibling(&local_50,&local_58);
  cpp_function::
  cpp_function<Neyn::Error,Server_,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_28,f_00,extra,&local_40,(sibling *)&local_48);
  object::~object((object *)&local_58);
  none::~none((none *)&local_70);
  detail::add_class_method((object *)this,name_,&local_28);
  cpp_function::~cpp_function(&local_28);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }